

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli.c
# Opt level: O1

int main(int argc,char **argv)

{
  byte bVar1;
  FILE *__stream;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  size_t sVar6;
  int iVar7;
  int iVar8;
  BrotliDecoderResult BVar9;
  char *pcVar10;
  size_t sVar11;
  long lVar12;
  long lVar13;
  char *pcVar14;
  char *pcVar15;
  BrotliDecoderState *state;
  BrotliEncoderState *state_00;
  uint32_t value;
  int *__n;
  int *result;
  undefined8 *puVar16;
  ulong uVar17;
  uint uVar18;
  bool bVar19;
  int iVar20;
  uint uVar21;
  bool bVar22;
  uint local_1ac;
  int local_19c;
  int local_194;
  ulong local_170;
  Context local_168;
  ulong local_38;
  
  local_168.quality = 0xb;
  local_168.lgwin = -1;
  local_168.verbosity = 0;
  local_168.force_overwrite = 0;
  local_168.junk_source = 0;
  local_168.copy_stat = 1;
  local_168.write_to_stdout = 0;
  local_168.test_integrity = 0;
  local_168.decompress = 0;
  local_168.large_window = 0;
  uVar18 = 0;
  local_168.output_path = (char *)0x0;
  local_168.suffix = ".br";
  local_168.not_input_indices[0] = 0;
  local_168.not_input_indices[1] = 0;
  local_168.not_input_indices[2] = 0;
  local_168.not_input_indices[3] = 0;
  local_168.not_input_indices[4] = 0;
  local_168.not_input_indices[5] = 0;
  local_168.not_input_indices[6] = 0;
  local_168.not_input_indices[7] = 0;
  local_168.not_input_indices[8] = 0;
  local_168.not_input_indices[9] = 0;
  local_168.not_input_indices[10] = 0;
  local_168.not_input_indices[0xb] = 0;
  local_168.not_input_indices[0xc] = 0;
  local_168.not_input_indices[0xd] = 0;
  local_168.not_input_indices[0xe] = 0;
  local_168.not_input_indices[0xf] = 0;
  local_168.not_input_indices[0x10] = 0;
  local_168.not_input_indices[0x11] = 0;
  local_168.not_input_indices[0x12] = 0;
  local_168.not_input_indices[0x13] = 0;
  local_168.longest_path_len = 1;
  local_168.input_count = 0;
  local_168.buffer = (uint8_t *)0x0;
  local_168.modified_path = (char *)0x0;
  local_168.iterator = 0;
  local_168.ignore = 0;
  local_168.iterator_error = 0;
  local_168.current_input_path = (char *)0x0;
  local_168.current_output_path = (char *)0x0;
  local_168.fin = (FILE *)0x0;
  local_168.fout = (FILE *)0x0;
  pcVar15 = *argv;
  local_168.argc = argc;
  local_168.argv = argv;
  pcVar10 = strrchr(pcVar15,0x2f);
  pcVar14 = pcVar10 + 1;
  if (pcVar10 == (char *)0x0) {
    pcVar14 = pcVar15;
  }
  pcVar10 = strrchr(pcVar14,0x5c);
  pcVar15 = pcVar10 + 1;
  if (pcVar10 == (char *)0x0) {
    pcVar15 = pcVar14;
  }
  iVar7 = strncmp(pcVar15,"unbrotli",8);
  if (iVar7 == 0) {
    uVar18 = (uint)(pcVar15[8] == '\0' || pcVar15[8] == '.');
  }
  bVar22 = false;
  if (argc < 2) {
    local_170 = 1;
    uVar17 = 0;
  }
  else {
    local_170 = 1;
    iVar7 = 1;
    iVar20 = 0;
    bVar2 = false;
    bVar3 = false;
    local_194 = 0;
    bVar5 = false;
    bVar22 = false;
    local_19c = 0;
    bVar4 = false;
    local_38 = 0;
    do {
      pcVar15 = argv[iVar7];
      if (pcVar15 == (char *)0x0) {
        sVar11 = 0;
      }
      else {
        sVar11 = strlen(pcVar15);
      }
      if (sVar11 == 0) {
        lVar12 = (long)iVar20;
        iVar20 = iVar20 + 1;
        local_168.not_input_indices[lVar12] = iVar7;
LAB_00102dd7:
        uVar21 = 0;
      }
      else if (iVar20 < 0x13) {
        if (((bVar2) || (sVar11 == 1)) || (*pcVar15 != '-')) {
          local_38 = local_38 + 1;
          if (local_170 <= sVar11) {
            local_170 = sVar11;
          }
          goto LAB_00102dd7;
        }
        lVar12 = (long)iVar20;
        iVar20 = iVar20 + 1;
        local_168.not_input_indices[lVar12] = iVar7;
        if ((sVar11 == 2) && (pcVar15[1] == '-')) {
          uVar21 = 0;
          bVar2 = true;
        }
        else {
          if (pcVar15[1] == '-') {
            pcVar15 = pcVar15 + 2;
            iVar8 = strcmp("best",pcVar15);
            if (iVar8 == 0) {
              if (local_19c != 0) {
                main_cold_27();
LAB_001035ba:
                local_1ac = 3;
LAB_001036b7:
                bVar2 = false;
                uVar21 = 1;
                goto LAB_00102de2;
              }
              local_168.quality = 0xb;
              local_19c = 1;
            }
            else {
              iVar8 = strcmp("decompress",pcVar15);
              if (iVar8 == 0) {
                if (bVar4) {
                  main_cold_26();
LAB_00103640:
                  bVar4 = true;
LAB_001036b1:
                  local_1ac = 3;
                  goto LAB_001036b7;
                }
                bVar4 = true;
                uVar18 = 1;
              }
              else {
                iVar8 = strcmp("force",pcVar15);
                if (iVar8 == 0) {
                  if (local_168.force_overwrite != 0) {
                    main_cold_25();
                    goto LAB_001035ba;
                  }
                  local_168.force_overwrite = 1;
                }
                else {
                  iVar8 = strcmp("help",pcVar15);
                  uVar21 = 1;
                  bVar2 = false;
                  if (iVar8 == 0) {
                    local_1ac = 2;
                    goto LAB_001036b7;
                  }
                  iVar8 = strcmp("keep",pcVar15);
                  if (iVar8 == 0) {
                    if (bVar5) {
                      main_cold_24();
LAB_001036a1:
                      bVar5 = true;
                      goto LAB_001036b1;
                    }
                    local_168._16_8_ = local_168._16_8_ & 0xffffffff00000000;
LAB_001035f8:
                    bVar5 = true;
                  }
                  else {
                    iVar8 = strcmp("no-copy-stat",pcVar15);
                    if (iVar8 == 0) {
                      if (local_168.copy_stat == 0) {
                        main_cold_23();
LAB_001036c9:
                        local_1ac = 3;
                        goto LAB_001036b7;
                      }
                      local_168._16_8_ = local_168._16_8_ & 0xffffffff;
                    }
                    else {
                      iVar8 = strcmp("rm",pcVar15);
                      if (iVar8 == 0) {
                        if (bVar5) {
                          main_cold_22();
                          goto LAB_001036a1;
                        }
                        local_168.junk_source = 1;
                        goto LAB_001035f8;
                      }
                      iVar8 = strcmp("stdout",pcVar15);
                      if (iVar8 == 0) {
                        if (bVar22) {
                          main_cold_21();
                          bVar22 = true;
                          goto LAB_001036b1;
                        }
                        local_168.write_to_stdout = 1;
                        bVar22 = true;
                      }
                      else {
                        iVar8 = strcmp("test",pcVar15);
                        if (iVar8 == 0) {
                          if (bVar4) {
                            main_cold_20();
                            goto LAB_00103640;
                          }
                          uVar18 = 4;
                          bVar4 = true;
                        }
                        else {
                          iVar8 = strcmp("verbose",pcVar15);
                          if (iVar8 == 0) {
                            if (0 < local_168.verbosity) {
                              main_cold_19();
                              goto LAB_001036c9;
                            }
                            local_168.verbosity = 1;
                          }
                          else {
                            iVar8 = strcmp("version",pcVar15);
                            if (iVar8 == 0) {
                              local_1ac = 6;
                              goto LAB_001036b7;
                            }
                            pcVar14 = strrchr(pcVar15,0x3d);
                            if ((pcVar14 == (char *)0x0) || (pcVar14[1] == '\0')) {
                              pcVar14 = "must pass the parameter as --%s=value\n";
LAB_001037b0:
                              bVar19 = false;
                              fprintf(_stderr,pcVar14,pcVar15);
                              local_1ac = 3;
                              goto LAB_001038a9;
                            }
                            pcVar10 = pcVar14 + 1;
                            __n = (int *)(pcVar14 + -(long)pcVar15);
                            result = __n;
                            iVar8 = strncmp("lgwin",pcVar15,(size_t)__n);
                            if (iVar8 == 0) {
                              if (local_194 != 0) {
                                main_cold_18();
                                goto LAB_00103897;
                              }
                              iVar8 = 0x18;
LAB_0010371c:
                              local_194 = ParseInt(pcVar10,iVar8,(int)&local_168 + 4,result);
                              if (local_194 == 0) {
                                local_194 = 0;
                                pcVar15 = "error parsing lgwin value [%s]\n";
LAB_00103837:
                                fprintf(_stderr,pcVar15,pcVar10);
LAB_00103841:
                                local_1ac = 3;
                                bVar19 = false;
                              }
                              else {
                                bVar19 = true;
                                if (local_168.lgwin < 10 && local_168.lgwin != 0) {
                                  bVar19 = false;
                                  fprintf(_stderr,
                                          "lgwin parameter (%d) smaller than the minimum (%d)\n",
                                          (ulong)(uint)local_168.lgwin,10);
                                  local_1ac = 3;
                                }
                              }
                            }
                            else {
                              iVar8 = strncmp("large_window",pcVar15,(size_t)__n);
                              if (iVar8 == 0) {
                                if (local_194 == 0) {
                                  iVar8 = 0x1e;
                                  goto LAB_0010371c;
                                }
                                main_cold_17();
LAB_00103897:
                                local_1ac = 3;
                                bVar19 = false;
                              }
                              else {
                                iVar8 = strncmp("output",pcVar15,(size_t)__n);
                                if (iVar8 == 0) {
                                  if (bVar22) {
                                    main_cold_16();
                                    goto LAB_00103897;
                                  }
                                  bVar19 = true;
                                  local_168.output_path = pcVar10;
                                }
                                else {
                                  iVar8 = strncmp("quality",pcVar15,(size_t)__n);
                                  if (iVar8 == 0) {
                                    if (local_19c != 0) {
                                      main_cold_15();
                                      goto LAB_00103841;
                                    }
                                    local_19c = ParseInt(pcVar10,0xb,(int)&local_168,result);
                                    if (local_19c == 0) {
                                      local_19c = 0;
                                      pcVar15 = "error parsing quality value [%s]\n";
                                      goto LAB_00103837;
                                    }
                                    bVar19 = true;
                                  }
                                  else {
                                    iVar8 = strncmp("suffix",pcVar15,(size_t)__n);
                                    if (iVar8 != 0) {
                                      pcVar14 = "invalid parameter: [%s]\n";
                                      goto LAB_001037b0;
                                    }
                                    if (bVar3) {
                                      main_cold_14();
                                      local_1ac = 3;
                                      pcVar10 = local_168.suffix;
                                    }
                                    local_168.suffix = pcVar10;
                                    bVar19 = !bVar3;
                                    bVar3 = true;
                                  }
                                }
                              }
                            }
LAB_001038a9:
                            if (!bVar19) goto LAB_00102de2;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
          else {
            uVar17 = 2;
            if (2 < sVar11) {
              uVar17 = sVar11;
            }
            lVar12 = 0;
            do {
              bVar1 = pcVar15[lVar12 + 1];
              if ((byte)(bVar1 - 0x30) < 10) {
                if (local_19c == 0) {
                  local_168.quality = (char)bVar1 + -0x30;
LAB_00103075:
                  uVar21 = 7;
                  local_19c = 1;
                }
                else {
                  main_cold_13();
LAB_0010317e:
                  local_1ac = 3;
                  uVar21 = 1;
                }
                goto LAB_00103083;
              }
              uVar21 = 1;
              switch(bVar1) {
              case 99:
                if (bVar22) {
                  main_cold_3();
LAB_0010325c:
                  bVar22 = true;
                  goto LAB_0010317e;
                }
                local_168.write_to_stdout = 1;
                uVar21 = 7;
                bVar22 = true;
                break;
              case 100:
                if (bVar4) {
                  main_cold_2();
LAB_00103303:
                  bVar4 = true;
                  goto LAB_0010317e;
                }
                uVar21 = 7;
                bVar4 = true;
                uVar18 = 1;
                break;
              default:
                if ((bVar1 & 0xfe) == 0x6a) {
                  if (bVar5) {
                    main_cold_12();
                    bVar5 = true;
                    goto LAB_0010317e;
                  }
                  local_168.junk_source = (uint)(bVar1 == 0x6a);
                  uVar21 = 7;
                  bVar5 = true;
                  break;
                }
                if (bVar1 < 0x5a) {
                  if ((bVar1 == 0x44) || (bVar1 == 0x53)) goto switchD_001031ab_caseD_6f;
                  local_1ac = 6;
                  if (bVar1 != 0x56) goto switchD_001031ab_caseD_70;
                  break;
                }
                switch(bVar1) {
                case 0x6e:
                  if (local_168.copy_stat == 0) {
                    main_cold_11();
                    goto LAB_00103338;
                  }
                  local_168._16_8_ = local_168._16_8_ & 0xffffffff;
LAB_001030fa:
                  uVar21 = 7;
                  break;
                case 0x6f:
                case 0x71:
                case 0x77:
switchD_001031ab_caseD_6f:
                  if ((((sVar11 - 2 != lVar12) || (iVar7 = iVar7 + 1, iVar7 == argc)) ||
                      (pcVar14 = argv[iVar7], pcVar14 == (char *)0x0)) || (*pcVar14 == '\0')) {
                    pcVar14 = "expected parameter for argument -%c\n";
                    goto LAB_00103331;
                  }
                  lVar13 = (long)iVar20;
                  iVar20 = iVar20 + 1;
                  local_168.not_input_indices[lVar13] = iVar7;
                  pcVar10 = local_168.output_path;
                  if (bVar1 < 0x71) {
                    if (bVar1 == 0x53) {
                      if (bVar3) {
                        main_cold_4();
                        bVar3 = true;
                        goto LAB_0010317e;
                      }
                      bVar3 = true;
                      local_168.suffix = pcVar14;
                    }
                    else if ((bVar1 == 0x6f) && (pcVar10 = pcVar14, bVar22)) {
                      main_cold_7();
                      goto LAB_0010325c;
                    }
LAB_001033e2:
                    local_168.output_path = pcVar10;
                    uVar21 = 0;
                  }
                  else {
                    if (bVar1 == 0x71) {
                      if (local_19c == 0) {
                        local_19c = ParseInt(pcVar14,0xb,(int)&local_168,(int *)argv);
                        if (local_19c != 0) {
LAB_0010341a:
                          uVar21 = 0;
                          break;
                        }
                        local_19c = 0;
                        pcVar10 = "error parsing quality value [%s]\n";
LAB_001034eb:
                        fprintf(_stderr,pcVar10,pcVar14);
                      }
                      else {
                        main_cold_6();
                      }
                    }
                    else {
                      if (bVar1 != 0x77) goto LAB_001033e2;
                      if (local_194 == 0) {
                        local_194 = ParseInt(pcVar14,0x18,(int)&local_168 + 4,(int *)argv);
                        if (local_194 == 0) {
                          local_194 = 0;
                          pcVar10 = "error parsing lgwin value [%s]\n";
                          goto LAB_001034eb;
                        }
                        if (9 < local_168.lgwin || local_168.lgwin == 0) goto LAB_0010341a;
                        fprintf(_stderr,"lgwin parameter (%d) smaller than the minimum (%d)\n",
                                (ulong)(uint)local_168.lgwin,10);
                      }
                      else {
                        main_cold_5();
                      }
                    }
                    local_1ac = 3;
                  }
                  break;
                case 0x70:
                case 0x72:
                case 0x73:
                case 0x75:
switchD_001031ab_caseD_70:
                  pcVar14 = "invalid argument -%c\n";
LAB_00103331:
                  fprintf(_stderr,pcVar14);
                  goto LAB_00103338;
                case 0x74:
                  if (bVar4) {
                    main_cold_10();
                    goto LAB_00103303;
                  }
                  uVar21 = 7;
                  uVar18 = 4;
                  bVar4 = true;
                  break;
                case 0x76:
                  if (local_168.verbosity < 1) {
                    local_168.verbosity = 1;
                    goto LAB_001030fa;
                  }
                  main_cold_9();
                  goto LAB_00103338;
                default:
                  if (bVar1 != 0x5a) goto switchD_001031ab_caseD_70;
                  if (local_19c == 0) {
                    local_168.quality = 0xb;
                    goto LAB_00103075;
                  }
                  main_cold_8();
LAB_00103338:
                  local_1ac = 3;
                }
                break;
              case 0x66:
                if (local_168.force_overwrite == 0) {
                  local_168.force_overwrite = 1;
                  goto LAB_001030fa;
                }
                main_cold_1();
                goto LAB_00103338;
              case 0x68:
                local_1ac = 2;
              }
LAB_00103083:
              if ((uVar21 != 7) && (uVar21 != 0)) goto LAB_00103525;
              lVar12 = lVar12 + 1;
            } while (uVar17 - 1 != lVar12);
            uVar21 = 0;
LAB_00103525:
            bVar2 = false;
            if (uVar21 != 0) goto LAB_00102de2;
          }
          bVar2 = false;
          uVar21 = 0;
        }
      }
      else {
        main_cold_28();
        local_1ac = 3;
        uVar21 = 1;
      }
LAB_00102de2:
      if ((uVar21 & 3) != 0) goto LAB_0010398e;
      iVar7 = iVar7 + 1;
      uVar17 = local_38;
    } while (iVar7 < argc);
  }
  pcVar15 = local_168.suffix;
  local_168.decompress = (uint)(uVar18 == 1);
  local_168.test_integrity._0_1_ = uVar18 == 4;
  local_168.test_integrity._1_3_ = 0;
  local_1ac = 3;
  local_168.longest_path_len = local_170;
  local_168.input_count = uVar17;
  if ((((uVar17 < 2) || (!bVar22)) &&
      ((uVar18 != 4 || ((local_168.output_path == (char *)0x0 && (local_168.write_to_stdout == 0))))
      )) && (pcVar14 = strchr(local_168.suffix,0x2f), pcVar14 == (char *)0x0)) {
    pcVar15 = strchr(pcVar15,0x5c);
    local_1ac = 3;
    if (pcVar15 == (char *)0x0) {
      local_1ac = uVar18;
    }
  }
LAB_0010398e:
  sVar6 = local_168.longest_path_len;
  bVar22 = true;
  if ((local_1ac < 5) && ((0x13U >> (local_1ac & 0x1f) & 1) != 0)) {
    sVar11 = strlen(local_168.suffix);
    pcVar15 = (char *)malloc(sVar6 + sVar11 + 1);
    local_168.modified_path = pcVar15;
    local_168.buffer = (uint8_t *)malloc(0x100000);
    if ((pcVar15 == (char *)0x0) || (local_168.buffer == (uint8_t *)0x0)) {
      main_cold_29();
      bVar22 = false;
      local_1ac = 5;
    }
    else {
      local_168.output = local_168.buffer + 0x80000;
      local_168.input = local_168.buffer;
    }
  }
  switch(local_1ac) {
  case 0:
    do {
      iVar7 = NextFile(&local_168);
      if (iVar7 == 0) goto LAB_00103f22;
      state_00 = BrotliEncoderCreateInstance
                           ((brotli_alloc_func)0x0,(brotli_free_func)0x0,(void *)0x0);
      if (state_00 == (BrotliEncoderState *)0x0) {
        main_cold_39();
LAB_001040b3:
        bVar22 = false;
        break;
      }
      BrotliEncoderSetParameter(state_00,BROTLI_PARAM_QUALITY,local_168.quality);
      if (local_168.lgwin < 1) {
        value = 0x18;
        if (-1 < local_168.input_file_length) {
          lVar12 = 10;
          do {
            if ((ulong)local_168.input_file_length <= (1L << ((byte)lVar12 & 0x3f)) - 0x10U) {
              value = (uint32_t)lVar12;
              break;
            }
            lVar12 = lVar12 + 1;
          } while (lVar12 != 0x18);
        }
      }
      else {
        if (0x18 < local_168.lgwin) {
          BrotliEncoderSetParameter(state_00,BROTLI_PARAM_LARGE_WINDOW,1);
        }
        value = local_168.lgwin;
      }
      BrotliEncoderSetParameter(state_00,BROTLI_PARAM_LGWIN,value);
      if (0 < local_168.input_file_length) {
        uVar17 = local_168.input_file_length;
        if (0x3fffffff < local_168.input_file_length) {
          uVar17 = 0x40000000;
        }
        BrotliEncoderSetParameter(state_00,BROTLI_PARAM_SIZE_HINT,(uint32_t)uVar17);
      }
      iVar7 = OpenFiles(&local_168);
      if (iVar7 == 0) {
LAB_00103e7e:
        bVar2 = false;
        iVar7 = 0;
      }
      else {
        if (((local_168.current_output_path == (char *)0x0) && (local_168.force_overwrite == 0)) &&
           (iVar7 = isatty(1), iVar7 != 0)) {
          main_cold_36();
          goto LAB_00103e7e;
        }
        local_168.available_in = 0;
        local_168.next_in = (uint8_t *)0x0;
        local_168.available_out = 0x80000;
        local_168.next_out = local_168.output;
        local_168.total_in = 0;
        local_168.total_out = 0;
        bVar22 = false;
        do {
          if ((!bVar22) && (local_168.available_in == 0)) {
            iVar7 = ProvideInput(&local_168);
            if (iVar7 == 0) goto LAB_00103e7e;
            iVar7 = feof((FILE *)local_168.fin);
            bVar22 = iVar7 != 0;
          }
          iVar7 = BrotliEncoderCompressStream
                            (state_00,(uint)bVar22 * 2,&local_168.available_in,&local_168.next_in,
                             &local_168.available_out,&local_168.next_out,(size_t *)0x0);
          if (iVar7 == 0) {
            main_cold_38();
            goto LAB_00103e7e;
          }
          if (local_168.available_out == 0) {
            iVar7 = WriteOutput(&local_168);
            if (iVar7 == 0) goto LAB_00103e7e;
            local_168.available_out = 0x80000;
            local_168.next_out = local_168.output;
          }
          iVar7 = BrotliEncoderIsFinished(state_00);
        } while (iVar7 == 0);
        iVar7 = WriteOutput(&local_168);
        if (iVar7 == 0) goto LAB_00103e7e;
        local_168.available_out = 0;
        iVar7 = 1;
        bVar2 = true;
        if (0 < local_168.verbosity) {
          main_cold_37();
        }
      }
      bVar22 = false;
      BrotliEncoderDestroyInstance(state_00);
      iVar7 = CloseFiles(&local_168,iVar7);
    } while ((bVar2) && (iVar7 != 0));
    break;
  case 1:
  case 4:
    do {
      iVar7 = NextFile(&local_168);
      if (iVar7 == 0) goto LAB_00103f22;
      state = BrotliDecoderCreateInstance((brotli_alloc_func)0x0,(brotli_free_func)0x0,(void *)0x0);
      if (state == (BrotliDecoderState *)0x0) {
        main_cold_35();
        goto LAB_001040b3;
      }
      BrotliDecoderSetParameter(state,BROTLI_DECODER_PARAM_LARGE_WINDOW,1);
      bVar22 = false;
      BrotliDecoderSetParameter(state,BROTLI_DECODER_PARAM_LARGE_WINDOW,0);
      iVar7 = OpenFiles(&local_168);
      if (iVar7 != 0) {
        if (((local_168.current_input_path != (char *)0x0) || (local_168.force_overwrite != 0)) ||
           (iVar7 = isatty(0), iVar7 == 0)) {
          local_168.available_in = 0;
          local_168.next_in = (uint8_t *)0x0;
          local_168.available_out = 0x80000;
          local_168.next_out = local_168.output;
          local_168.total_in = 0;
          local_168.total_out = 0;
          BVar9 = BROTLI_DECODER_RESULT_NEEDS_MORE_INPUT;
          do {
            if (BVar9 == BROTLI_DECODER_RESULT_NEEDS_MORE_INPUT) {
              iVar7 = feof((FILE *)local_168.fin);
              if (iVar7 != 0) {
                main_cold_33();
                goto LAB_00103bf5;
              }
              iVar7 = ProvideInput(&local_168);
              if (iVar7 == 0) goto LAB_00103bf5;
            }
            else {
              if (BVar9 != BROTLI_DECODER_RESULT_NEEDS_MORE_OUTPUT) {
                if (BVar9 == BROTLI_DECODER_RESULT_SUCCESS) {
                  iVar7 = WriteOutput(&local_168);
                  if (iVar7 != 0) {
                    local_168.available_out = 0;
                    if ((local_168.available_in == 0) &&
                       (iVar7 = fgetc((FILE *)local_168.fin), iVar7 == -1)) {
                      iVar7 = 1;
                      bVar2 = true;
                      if (0 < local_168.verbosity) {
                        main_cold_32();
                      }
                      goto LAB_00103bfb;
                    }
                    main_cold_31();
                  }
                }
                else {
                  main_cold_34();
                }
                goto LAB_00103bf5;
              }
              iVar7 = WriteOutput(&local_168);
              if (iVar7 == 0) goto LAB_00103bf5;
              local_168.available_out = 0x80000;
              local_168.next_out = local_168.output;
            }
            BVar9 = BrotliDecoderDecompressStream
                              (state,&local_168.available_in,&local_168.next_in,
                               &local_168.available_out,&local_168.next_out,(size_t *)0x0);
          } while( true );
        }
        main_cold_30();
      }
LAB_00103bf5:
      bVar2 = false;
      iVar7 = 0;
LAB_00103bfb:
      BrotliDecoderDestroyInstance(state);
      iVar7 = CloseFiles(&local_168,iVar7);
    } while ((bVar2) && (iVar7 != 0));
    break;
  default:
    pcVar15 = *argv;
    pcVar10 = strrchr(pcVar15,0x2f);
    pcVar14 = pcVar10 + 1;
    if (pcVar10 == (char *)0x0) {
      pcVar14 = pcVar15;
    }
    pcVar10 = strrchr(pcVar14,0x5c);
    pcVar15 = pcVar10 + 1;
    if (pcVar10 == (char *)0x0) {
      pcVar15 = pcVar14;
    }
    bVar22 = local_1ac == 2;
    if (bVar22) {
      puVar16 = (undefined8 *)&stderr;
    }
    else {
      puVar16 = (undefined8 *)&stdout;
    }
    __stream = (FILE *)*puVar16;
    fprintf(__stream,"Usage: %s [OPTION]... [FILE]...\n",pcVar15);
    fwrite("Options:\n  -#                          compression level (0-9)\n  -c, --stdout                write on standard output\n  -d, --decompress            decompress\n  -f, --force                 force output file overwrite\n  -h, --help                  display this help and exit\n"
           ,0x112,1,__stream);
    fwrite("  -j, --rm                    remove source file(s)\n  -k, --keep                  keep source file(s) (default)\n  -n, --no-copy-stat          do not copy source file(s) attributes\n  -o FILE, --output=FILE      output file (only if 1 input file)\n"
           ,0xf5,1,__stream);
    fprintf(__stream,"  -q NUM, --quality=NUM       compression level (%d-%d)\n",0,0xb);
    fwrite("  -t, --test                  test compressed file integrity\n  -v, --verbose               verbose mode\n"
           ,0x68,1,__stream);
    fprintf(__stream,
            "  -w NUM, --lgwin=NUM         set LZ77 window size (0, %d-%d)\n                              window size = 2**NUM - 16\n                              0 lets compressor choose the optimal value\n"
            ,10,0x18);
    fprintf(__stream,
            "  --large_window=NUM          use incompatible large-window brotli\n                              bitstream with window size (0, %d-%d)\n                              WARNING: this format is not compatible\n                              with brotli RFC 7932 and may not be\n                              decodable with regular brotli decoders\n"
            ,10,0x1e);
    fprintf(__stream,"  -S SUF, --suffix=SUF        output file suffix (default:\'%s\')\n",".br");
    fwrite("  -V, --version               display version and exit\n  -Z, --best                  use best compression level (11) (default)\nSimple options could be coalesced, i.e. \'-9kf\' is equivalent to \'-9 -k -f\'.\nWith no FILE, or when FILE is -, read standard input.\nAll arguments after \'--\' are treated as files.\n"
           ,0x130,1,__stream);
    break;
  case 5:
    break;
  case 6:
    fprintf(_stdout,"brotli %d.%d.%d\n",1,0,7);
  }
LAB_00104054:
  iVar7 = local_168.iterator_error;
  free(local_168.modified_path);
  free(local_168.buffer);
  if ((bVar22) && (iVar7 == 0)) {
    return 0;
  }
  exit(1);
LAB_00103f22:
  bVar22 = true;
  goto LAB_00104054;
}

Assistant:

int main(int argc, char** argv) {
  Command command;
  Context context;
  BROTLI_BOOL is_ok = BROTLI_TRUE;
  int i;

  context.quality = 11;
  context.lgwin = -1;
  context.verbosity = 0;
  context.force_overwrite = BROTLI_FALSE;
  context.junk_source = BROTLI_FALSE;
  context.copy_stat = BROTLI_TRUE;
  context.test_integrity = BROTLI_FALSE;
  context.write_to_stdout = BROTLI_FALSE;
  context.decompress = BROTLI_FALSE;
  context.large_window = BROTLI_FALSE;
  context.output_path = NULL;
  context.suffix = DEFAULT_SUFFIX;
  for (i = 0; i < MAX_OPTIONS; ++i) context.not_input_indices[i] = 0;
  context.longest_path_len = 1;
  context.input_count = 0;

  context.argc = argc;
  context.argv = argv;
  context.modified_path = NULL;
  context.iterator = 0;
  context.ignore = 0;
  context.iterator_error = BROTLI_FALSE;
  context.buffer = NULL;
  context.current_input_path = NULL;
  context.current_output_path = NULL;
  context.fin = NULL;
  context.fout = NULL;

  command = ParseParams(&context);

  if (command == COMMAND_COMPRESS || command == COMMAND_DECOMPRESS ||
      command == COMMAND_TEST_INTEGRITY) {
    if (is_ok) {
      size_t modified_path_len =
          context.longest_path_len + strlen(context.suffix) + 1;
      context.modified_path = (char*)malloc(modified_path_len);
      context.buffer = (uint8_t*)malloc(kFileBufferSize * 2);
      if (!context.modified_path || !context.buffer) {
        fprintf(stderr, "out of memory\n");
        is_ok = BROTLI_FALSE;
      } else {
        context.input = context.buffer;
        context.output = context.buffer + kFileBufferSize;
      }
    }
  }

  if (!is_ok) command = COMMAND_NOOP;

  switch (command) {
    case COMMAND_NOOP:
      break;

    case COMMAND_VERSION:
      PrintVersion();
      break;

    case COMMAND_COMPRESS:
      is_ok = CompressFiles(&context);
      break;

    case COMMAND_DECOMPRESS:
    case COMMAND_TEST_INTEGRITY:
      is_ok = DecompressFiles(&context);
      break;

    case COMMAND_HELP:
    case COMMAND_INVALID:
    default:
      is_ok = (command == COMMAND_HELP);
      PrintHelp(FileName(argv[0]), is_ok);
      break;
  }

  if (context.iterator_error) is_ok = BROTLI_FALSE;

  free(context.modified_path);
  free(context.buffer);

  if (!is_ok) exit(1);
  return 0;
}